

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_5_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_908;
  float c4s;
  float *input4;
  float *pfStack_8f8;
  float c3s;
  float *input3;
  float *pfStack_8e8;
  float c2s;
  float *input2;
  float *pfStack_8d8;
  float c1s;
  float *input1;
  float *pfStack_8c8;
  float c0s;
  float *input0;
  float *output;
  float *input0_end_local;
  float **inputs_local;
  float *vertical_coefficients_local;
  float *outputp_local;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  
  fVar1 = *vertical_coefficients;
  pfStack_8d8 = inputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_8e8 = inputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_8f8 = inputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_908 = inputs[4];
  fVar5 = vertical_coefficients[4];
  input0 = outputp;
  for (pfStack_8c8 = *inputs; 0x3f < (long)input0_end - (long)pfStack_8c8;
      pfStack_8c8 = pfStack_8c8 + 0x10) {
    local_3f8 = (float)*(undefined8 *)pfStack_8c8;
    fStack_3f4 = (float)((ulong)*(undefined8 *)pfStack_8c8 >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(pfStack_8c8 + 2);
    fStack_3ec = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 2) >> 0x20);
    local_d8 = (float)*(undefined8 *)input0;
    fStack_d4 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_d0 = (float)*(undefined8 *)(input0 + 2);
    fStack_cc = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_418 = (float)*(undefined8 *)(pfStack_8c8 + 4);
    fStack_414 = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 4) >> 0x20);
    fStack_410 = (float)*(undefined8 *)(pfStack_8c8 + 6);
    fStack_40c = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 6) >> 0x20);
    local_f8 = (float)*(undefined8 *)(input0 + 4);
    fStack_f4 = (float)((ulong)*(undefined8 *)(input0 + 4) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(input0 + 6);
    fStack_ec = (float)((ulong)*(undefined8 *)(input0 + 6) >> 0x20);
    local_438 = (float)*(undefined8 *)(pfStack_8c8 + 8);
    fStack_434 = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 8) >> 0x20);
    fStack_430 = (float)*(undefined8 *)(pfStack_8c8 + 10);
    fStack_42c = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 10) >> 0x20);
    local_118 = (float)*(undefined8 *)(input0 + 8);
    fStack_114 = (float)((ulong)*(undefined8 *)(input0 + 8) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(input0 + 10);
    fStack_10c = (float)((ulong)*(undefined8 *)(input0 + 10) >> 0x20);
    local_458 = (float)*(undefined8 *)(pfStack_8c8 + 0xc);
    fStack_454 = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 0xc) >> 0x20);
    fStack_450 = (float)*(undefined8 *)(pfStack_8c8 + 0xe);
    fStack_44c = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 0xe) >> 0x20);
    local_138 = (float)*(undefined8 *)(input0 + 0xc);
    fStack_134 = (float)((ulong)*(undefined8 *)(input0 + 0xc) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(input0 + 0xe);
    fStack_12c = (float)((ulong)*(undefined8 *)(input0 + 0xe) >> 0x20);
    local_478 = (float)*(undefined8 *)pfStack_8d8;
    fStack_474 = (float)((ulong)*(undefined8 *)pfStack_8d8 >> 0x20);
    fStack_470 = (float)*(undefined8 *)(pfStack_8d8 + 2);
    fStack_46c = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 2) >> 0x20);
    local_498 = (float)*(undefined8 *)(pfStack_8d8 + 4);
    fStack_494 = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 4) >> 0x20);
    fStack_490 = (float)*(undefined8 *)(pfStack_8d8 + 6);
    fStack_48c = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 6) >> 0x20);
    local_4b8 = (float)*(undefined8 *)(pfStack_8d8 + 8);
    fStack_4b4 = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 8) >> 0x20);
    fStack_4b0 = (float)*(undefined8 *)(pfStack_8d8 + 10);
    fStack_4ac = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 10) >> 0x20);
    local_4d8 = (float)*(undefined8 *)(pfStack_8d8 + 0xc);
    fStack_4d4 = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 0xc) >> 0x20);
    fStack_4d0 = (float)*(undefined8 *)(pfStack_8d8 + 0xe);
    fStack_4cc = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 0xe) >> 0x20);
    local_4f8 = (float)*(undefined8 *)pfStack_8e8;
    fStack_4f4 = (float)((ulong)*(undefined8 *)pfStack_8e8 >> 0x20);
    fStack_4f0 = (float)*(undefined8 *)(pfStack_8e8 + 2);
    fStack_4ec = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 2) >> 0x20);
    local_518 = (float)*(undefined8 *)(pfStack_8e8 + 4);
    fStack_514 = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 4) >> 0x20);
    fStack_510 = (float)*(undefined8 *)(pfStack_8e8 + 6);
    fStack_50c = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 6) >> 0x20);
    local_538 = (float)*(undefined8 *)(pfStack_8e8 + 8);
    fStack_534 = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 8) >> 0x20);
    fStack_530 = (float)*(undefined8 *)(pfStack_8e8 + 10);
    fStack_52c = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 10) >> 0x20);
    local_558 = (float)*(undefined8 *)(pfStack_8e8 + 0xc);
    fStack_554 = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 0xc) >> 0x20);
    fStack_550 = (float)*(undefined8 *)(pfStack_8e8 + 0xe);
    fStack_54c = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 0xe) >> 0x20);
    local_578 = (float)*(undefined8 *)pfStack_8f8;
    fStack_574 = (float)((ulong)*(undefined8 *)pfStack_8f8 >> 0x20);
    fStack_570 = (float)*(undefined8 *)(pfStack_8f8 + 2);
    fStack_56c = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 2) >> 0x20);
    local_598 = (float)*(undefined8 *)(pfStack_8f8 + 4);
    fStack_594 = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 4) >> 0x20);
    fStack_590 = (float)*(undefined8 *)(pfStack_8f8 + 6);
    fStack_58c = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 6) >> 0x20);
    local_5b8 = (float)*(undefined8 *)(pfStack_8f8 + 8);
    fStack_5b4 = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 8) >> 0x20);
    fStack_5b0 = (float)*(undefined8 *)(pfStack_8f8 + 10);
    fStack_5ac = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 10) >> 0x20);
    local_5d8 = (float)*(undefined8 *)(pfStack_8f8 + 0xc);
    fStack_5d4 = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 0xc) >> 0x20);
    fStack_5d0 = (float)*(undefined8 *)(pfStack_8f8 + 0xe);
    fStack_5cc = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 0xe) >> 0x20);
    local_5f8 = (float)*(undefined8 *)pfStack_908;
    fStack_5f4 = (float)((ulong)*(undefined8 *)pfStack_908 >> 0x20);
    fStack_5f0 = (float)*(undefined8 *)(pfStack_908 + 2);
    fStack_5ec = (float)((ulong)*(undefined8 *)(pfStack_908 + 2) >> 0x20);
    o1[3] = fStack_d4 + fStack_3f4 * fVar1 + fStack_474 * fVar2 + fStack_4f4 * fVar3 +
            fStack_574 * fVar4 + fStack_5f4 * fVar5;
    o1[2] = local_d8 + local_3f8 * fVar1 + local_478 * fVar2 + local_4f8 * fVar3 + local_578 * fVar4
            + local_5f8 * fVar5;
    o0[1] = fStack_cc + fStack_3ec * fVar1 + fStack_46c * fVar2 + fStack_4ec * fVar3 +
            fStack_56c * fVar4 + fStack_5ec * fVar5;
    o0[0] = fStack_d0 + fStack_3f0 * fVar1 + fStack_470 * fVar2 + fStack_4f0 * fVar3 +
            fStack_570 * fVar4 + fStack_5f0 * fVar5;
    local_618 = (float)*(undefined8 *)(pfStack_908 + 4);
    fStack_614 = (float)((ulong)*(undefined8 *)(pfStack_908 + 4) >> 0x20);
    fStack_610 = (float)*(undefined8 *)(pfStack_908 + 6);
    fStack_60c = (float)((ulong)*(undefined8 *)(pfStack_908 + 6) >> 0x20);
    o2[3] = fStack_f4 + fStack_414 * fVar1 + fStack_494 * fVar2 + fStack_514 * fVar3 +
            fStack_594 * fVar4 + fStack_614 * fVar5;
    o2[2] = local_f8 + local_418 * fVar1 + local_498 * fVar2 + local_518 * fVar3 + local_598 * fVar4
            + local_618 * fVar5;
    o1[1] = fStack_ec + fStack_40c * fVar1 + fStack_48c * fVar2 + fStack_50c * fVar3 +
            fStack_58c * fVar4 + fStack_60c * fVar5;
    o1[0] = fStack_f0 + fStack_410 * fVar1 + fStack_490 * fVar2 + fStack_510 * fVar3 +
            fStack_590 * fVar4 + fStack_610 * fVar5;
    local_638 = (float)*(undefined8 *)(pfStack_908 + 8);
    fStack_634 = (float)((ulong)*(undefined8 *)(pfStack_908 + 8) >> 0x20);
    fStack_630 = (float)*(undefined8 *)(pfStack_908 + 10);
    fStack_62c = (float)((ulong)*(undefined8 *)(pfStack_908 + 10) >> 0x20);
    o3[3] = fStack_114 + fStack_434 * fVar1 + fStack_4b4 * fVar2 + fStack_534 * fVar3 +
            fStack_5b4 * fVar4 + fStack_634 * fVar5;
    o3[2] = local_118 + local_438 * fVar1 + local_4b8 * fVar2 + local_538 * fVar3 +
            local_5b8 * fVar4 + local_638 * fVar5;
    o2[1] = fStack_10c + fStack_42c * fVar1 + fStack_4ac * fVar2 + fStack_52c * fVar3 +
            fStack_5ac * fVar4 + fStack_62c * fVar5;
    o2[0] = fStack_110 + fStack_430 * fVar1 + fStack_4b0 * fVar2 + fStack_530 * fVar3 +
            fStack_5b0 * fVar4 + fStack_630 * fVar5;
    local_658 = (float)*(undefined8 *)(pfStack_908 + 0xc);
    fStack_654 = (float)((ulong)*(undefined8 *)(pfStack_908 + 0xc) >> 0x20);
    fStack_650 = (float)*(undefined8 *)(pfStack_908 + 0xe);
    fStack_64c = (float)((ulong)*(undefined8 *)(pfStack_908 + 0xe) >> 0x20);
    r0[3] = fStack_134 + fStack_454 * fVar1 + fStack_4d4 * fVar2 + fStack_554 * fVar3 +
            fStack_5d4 * fVar4 + fStack_654 * fVar5;
    r0[2] = local_138 + local_458 * fVar1 + local_4d8 * fVar2 + local_558 * fVar3 +
            local_5d8 * fVar4 + local_658 * fVar5;
    o3[1] = fStack_12c + fStack_44c * fVar1 + fStack_4cc * fVar2 + fStack_54c * fVar3 +
            fStack_5cc * fVar4 + fStack_64c * fVar5;
    o3[0] = fStack_130 + fStack_450 * fVar1 + fStack_4d0 * fVar2 + fStack_550 * fVar3 +
            fStack_5d0 * fVar4 + fStack_650 * fVar5;
    *(undefined8 *)input0 = o1._8_8_;
    *(undefined8 *)(input0 + 2) = o0._0_8_;
    *(undefined8 *)(input0 + 4) = o2._8_8_;
    *(undefined8 *)(input0 + 6) = o1._0_8_;
    *(undefined8 *)(input0 + 8) = o3._8_8_;
    *(undefined8 *)(input0 + 10) = o2._0_8_;
    *(undefined8 *)(input0 + 0xc) = r0._8_8_;
    *(undefined8 *)(input0 + 0xe) = o3._0_8_;
    input0 = input0 + 0x10;
    pfStack_8d8 = pfStack_8d8 + 0x10;
    pfStack_8e8 = pfStack_8e8 + 0x10;
    pfStack_8f8 = pfStack_8f8 + 0x10;
    pfStack_908 = pfStack_908 + 0x10;
  }
  for (; 0xf < (long)input0_end - (long)pfStack_8c8; pfStack_8c8 = pfStack_8c8 + 4) {
    local_678 = (float)*(undefined8 *)pfStack_8c8;
    fStack_674 = (float)((ulong)*(undefined8 *)pfStack_8c8 >> 0x20);
    fStack_670 = (float)*(undefined8 *)(pfStack_8c8 + 2);
    fStack_66c = (float)((ulong)*(undefined8 *)(pfStack_8c8 + 2) >> 0x20);
    local_358 = (float)*(undefined8 *)input0;
    fStack_354 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_350 = (float)*(undefined8 *)(input0 + 2);
    fStack_34c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_698 = (float)*(undefined8 *)pfStack_8d8;
    fStack_694 = (float)((ulong)*(undefined8 *)pfStack_8d8 >> 0x20);
    fStack_690 = (float)*(undefined8 *)(pfStack_8d8 + 2);
    fStack_68c = (float)((ulong)*(undefined8 *)(pfStack_8d8 + 2) >> 0x20);
    local_6b8 = (float)*(undefined8 *)pfStack_8e8;
    fStack_6b4 = (float)((ulong)*(undefined8 *)pfStack_8e8 >> 0x20);
    fStack_6b0 = (float)*(undefined8 *)(pfStack_8e8 + 2);
    fStack_6ac = (float)((ulong)*(undefined8 *)(pfStack_8e8 + 2) >> 0x20);
    local_6d8 = (float)*(undefined8 *)pfStack_8f8;
    fStack_6d4 = (float)((ulong)*(undefined8 *)pfStack_8f8 >> 0x20);
    fStack_6d0 = (float)*(undefined8 *)(pfStack_8f8 + 2);
    fStack_6cc = (float)((ulong)*(undefined8 *)(pfStack_8f8 + 2) >> 0x20);
    local_6f8 = (float)*(undefined8 *)pfStack_908;
    fStack_6f4 = (float)((ulong)*(undefined8 *)pfStack_908 >> 0x20);
    fStack_6f0 = (float)*(undefined8 *)(pfStack_908 + 2);
    fStack_6ec = (float)((ulong)*(undefined8 *)(pfStack_908 + 2) >> 0x20);
    r0_1[3] = fStack_354 + fStack_674 * fVar1 + fStack_694 * fVar2 + fStack_6b4 * fVar3 +
              fStack_6d4 * fVar4 + fStack_6f4 * fVar5;
    r0_1[2] = local_358 + local_678 * fVar1 + local_698 * fVar2 + local_6b8 * fVar3 +
              local_6d8 * fVar4 + local_6f8 * fVar5;
    o0_1[1] = fStack_34c + fStack_66c * fVar1 + fStack_68c * fVar2 + fStack_6ac * fVar3 +
              fStack_6cc * fVar4 + fStack_6ec * fVar5;
    o0_1[0] = fStack_350 + fStack_670 * fVar1 + fStack_690 * fVar2 + fStack_6b0 * fVar3 +
              fStack_6d0 * fVar4 + fStack_6f0 * fVar5;
    *(undefined8 *)input0 = r0_1._8_8_;
    *(undefined8 *)(input0 + 2) = o0_1._0_8_;
    input0 = input0 + 4;
    pfStack_8d8 = pfStack_8d8 + 4;
    pfStack_8e8 = pfStack_8e8 + 4;
    pfStack_8f8 = pfStack_8f8 + 4;
    pfStack_908 = pfStack_908 + 4;
  }
  for (; pfStack_8c8 < input0_end; pfStack_8c8 = pfStack_8c8 + 1) {
    *input0 = *pfStack_908 * fVar5 +
              *pfStack_8f8 * fVar4 +
              *pfStack_8e8 * fVar3 + *pfStack_8d8 * fVar2 + *input0 + *pfStack_8c8 * fVar1;
    input0 = input0 + 1;
    pfStack_8d8 = pfStack_8d8 + 1;
    pfStack_8e8 = pfStack_8e8 + 1;
    pfStack_8f8 = pfStack_8f8 + 1;
    pfStack_908 = pfStack_908 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}